

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O0

Ptr __thiscall soul::SourceCodeText::createForFile(SourceCodeText *this,string *file,string *text)

{
  SourceCodeText *this_00;
  string local_60;
  string local_40;
  string *local_20;
  string *text_local;
  string *file_local;
  
  local_20 = text;
  text_local = file;
  file_local = (string *)this;
  this_00 = (SourceCodeText *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_40,(string *)file);
  std::__cxx11::string::string((string *)&local_60,(string *)text);
  SourceCodeText(this_00,&local_40,&local_60,false);
  RefCountedPtr<soul::SourceCodeText>::RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)this,this_00);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return (Ptr)this;
}

Assistant:

SourceCodeText::Ptr SourceCodeText::createForFile (std::string file, std::string text)
{
    return Ptr (*new SourceCodeText (std::move (file), std::move (text), false));
}